

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calendar.cpp
# Opt level: O0

void __thiscall icu_63::Calendar::updateTime(Calendar *this,UErrorCode *status)

{
  UBool UVar1;
  UErrorCode *status_local;
  Calendar *this_local;
  
  (*(this->super_UObject)._vptr_UObject[0x1c])(this,status);
  UVar1 = ::U_FAILURE(*status);
  if (UVar1 == '\0') {
    UVar1 = isLenient(this);
    if ((UVar1 != '\0') || (this->fAreAllFieldsSet == '\0')) {
      this->fAreFieldsSet = '\0';
    }
    this->fIsTimeSet = '\x01';
    this->fAreFieldsVirtuallySet = '\0';
  }
  return;
}

Assistant:

void
Calendar::updateTime(UErrorCode& status)
{
    computeTime(status);
    if(U_FAILURE(status))
        return;

    // If we are lenient, we need to recompute the fields to normalize
    // the values.  Also, if we haven't set all the fields yet (i.e.,
    // in a newly-created object), we need to fill in the fields. [LIU]
    if (isLenient() || ! fAreAllFieldsSet)
        fAreFieldsSet = FALSE;

    fIsTimeSet = TRUE;
    fAreFieldsVirtuallySet = FALSE;
}